

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O0

int Abc_NtkDontCareSimulateBefore(Odc_Man_t *p,uint *puTruth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int local_28;
  int local_24;
  int r;
  int Counter;
  int nRounds;
  int nIters;
  uint *puTruth_local;
  Odc_Man_t *p_local;
  
  iVar1 = p->nBits;
  iVar2 = p->nWords;
  local_24 = 0;
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    Abc_NtkDontCareSimulateSetRand(p);
    Abc_NtkDontCareSimulate(p,puTruth);
    iVar3 = Abc_NtkDontCareCountMintsWord(p,puTruth);
    local_24 = iVar3 + local_24;
  }
  return (local_24 * (iVar1 / iVar2)) / 2;
}

Assistant:

int Abc_NtkDontCareSimulateBefore( Odc_Man_t * p, unsigned * puTruth )
{
    int nIters = 2;
    int nRounds, Counter, r;
    // decide how many rounds to simulate
    nRounds = p->nBits / p->nWords;
    Counter = 0;
    for ( r = 0; r < nIters; r++ )
    {
        Abc_NtkDontCareSimulateSetRand( p );
        Abc_NtkDontCareSimulate( p, puTruth );
        Counter += Abc_NtkDontCareCountMintsWord( p, puTruth );
    }
    // normalize
    Counter = Counter * nRounds / nIters;
    return Counter;
}